

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O3

CURLSH * curl_share_init(void)

{
  undefined4 *puVar1;
  CURL *pCVar2;
  
  puVar1 = (undefined4 *)(*Curl_ccalloc)(1,0x100);
  if (puVar1 != (undefined4 *)0x0) {
    *puVar1 = 0x7e117a1e;
    *(byte *)(puVar1 + 1) = *(byte *)(puVar1 + 1) | 2;
    Curl_dnscache_init((Curl_dnscache *)(puVar1 + 0x28),0x17);
    pCVar2 = curl_easy_init();
    *(CURL **)(puVar1 + 10) = pCVar2;
    if (pCVar2 != (CURL *)0x0) {
      *(undefined4 *)((long)pCVar2 + 0x10) = 0;
      *(byte *)((long)pCVar2 + 0x13c0) = *(byte *)((long)pCVar2 + 0x13c0) | 0x10;
      return puVar1;
    }
    (*Curl_cfree)(puVar1);
  }
  return (CURLSH *)0x0;
}

Assistant:

CURLSH *
curl_share_init(void)
{
  struct Curl_share *share = calloc(1, sizeof(struct Curl_share));
  if(share) {
    share->magic = CURL_GOOD_SHARE;
    share->specifier |= (1 << CURL_LOCK_DATA_SHARE);
    Curl_dnscache_init(&share->dnscache, 23);
    share->admin = curl_easy_init();
    if(!share->admin) {
      free(share);
      return NULL;
    }
    /* admin handles have mid 0 */
    share->admin->mid = 0;
    share->admin->state.internal = TRUE;
#ifdef DEBUGBUILD
    if(getenv("CURL_DEBUG"))
      share->admin->set.verbose = TRUE;
#endif
  }

  return share;
}